

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O2

void __thiscall CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CMethod *stm)

{
  bool _isPublic;
  CIdExp *pCVar1;
  CType *pCVar2;
  element_type *peVar3;
  CArgumentList *pCVar4;
  CFieldList *pCVar5;
  CCompoundStm *pCVar6;
  IExpression *pIVar7;
  CMethod *pCVar8;
  MethodInfo *this_00;
  VariablesInfo *pVVar9;
  __shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2> local_58;
  CMethod *local_48;
  __shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__cxx11::string::assign
            ((char *)&((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->iName);
  pCVar1 = (stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  local_58._M_ptr = (element_type *)0x0;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->iType
              ).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  pCVar2 = (stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
           super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
           super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
  this_00 = (MethodInfo *)operator_new(0x58);
  peVar3 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _isPublic = stm->isPublic;
  local_48 = stm;
  std::__shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&(peVar3->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>);
  MethodInfo::MethodInfo(this_00,&peVar3->iName,_isPublic,(shared_ptr<TypeInfo> *)&local_40);
  std::__shared_ptr<MethodInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<MethodInfo,void>
            ((__shared_ptr<MethodInfo,(__gnu_cxx::_Lock_policy)2> *)&local_58,this_00);
  std::__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  pVVar9 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar9);
  std::__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<VariablesInfo,void>
            ((__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2> *)&local_58,pVVar9);
  std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  pCVar8 = local_48;
  pCVar4 = (local_48->arguments)._M_t.
           super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
           super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
           super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl;
  if (pCVar4 != (CArgumentList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar4->super_IWrapper).super_PositionedNode)(pCVar4,this);
  }
  peVar3 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((peVar3->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
             &(peVar3->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>);
  peVar3 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar3->definedVariables).
              super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
             &(peVar3->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>);
  pVVar9 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar9);
  std::__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<VariablesInfo,void>
            ((__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2> *)&local_58,pVVar9);
  std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  pCVar5 = (pCVar8->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>.
           _M_t.super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  if (pCVar5 != (CFieldList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar5->super_IWrapper).super_PositionedNode)(pCVar5,this);
  }
  peVar3 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((peVar3->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
             &(peVar3->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>);
  pCVar6 = (pCVar8->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  if (pCVar6 != (CCompoundStm *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar6->super_IStatement).super_PositionedNode)(pCVar6,this);
  }
  pIVar7 = (pCVar8->returnExp)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar7 != (IExpression *)0x0) {
    (*(code *)*(pIVar7->super_PositionedNode).super_INode._vptr_INode)(pIVar7,this);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CMethod &stm )
{
//	std::cout << "method\n";
	info->iName = "";
	stm.name->Accept( *this );

	info->iType = nullptr;
	stm.returnType->Accept( *this );

	info->iMethod = std::shared_ptr<MethodInfo>( new MethodInfo( info->iName, stm.isPublic, info->iType ) );

	info->iVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
	if( stm.arguments ) {
		stm.arguments->Accept( *this );
	}
    info->iMethod->arguments = info->iVariables;
    info->definedVariables = info->iVariables;
    info->iVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
	if( stm.vars ) {
		stm.vars->Accept( *this );
	}
	info->iMethod->fields = info->iVariables;

	if( stm.statements ) {
		stm.statements->Accept( *this );
	}
	if( stm.returnExp ) {
		stm.returnExp->Accept( *this );
	}
}